

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MSR_bank(DisasContext_conflict1 *s,arg_MSR_bank *a)

{
  int iVar1;
  arg_MSR_bank *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,9);
  if (iVar1 == 0) {
    gen_msr_banked(s,a->r,a->sysm,a->rn);
  }
  return iVar1 == 0;
}

Assistant:

static bool trans_MSR_bank(DisasContext *s, arg_MSR_bank *a)
{
    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    gen_msr_banked(s, a->r, a->sysm, a->rn);
    return true;
}